

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O1

void __thiscall OjaNewton::update_K(OjaNewton *this)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  
  if (0 < this->m) {
    fVar1 = (this->data).sketch_cnt;
    fVar2 = (this->data).norm2_x;
    lVar5 = 1;
    do {
      if (0 < this->m) {
        lVar6 = 0;
        do {
          this->K[lVar5][lVar6 + 1] =
               (this->data).delta[lVar5] * (this->data).Zx[lVar6 + 1] * (this->data).sketch_cnt +
               this->K[lVar5][lVar6 + 1];
          this->K[lVar5][lVar6 + 1] =
               (this->data).delta[lVar6 + 1] * (this->data).Zx[lVar5] * (this->data).sketch_cnt +
               this->K[lVar5][lVar6 + 1];
          pfVar3 = (this->data).delta;
          this->K[lVar5][lVar6 + 1] =
               pfVar3[lVar5] * pfVar3[lVar6 + 1] * fVar2 * fVar1 * fVar1 + this->K[lVar5][lVar6 + 1]
          ;
          lVar6 = lVar6 + 1;
        } while (lVar6 < this->m);
      }
      bVar4 = lVar5 < this->m;
      lVar5 = lVar5 + 1;
    } while (bVar4);
  }
  return;
}

Assistant:

void update_K()
  {
    float tmp = data.norm2_x * data.sketch_cnt * data.sketch_cnt;
    for (int i = 1; i <= m; i++)
    {
      for (int j = 1; j <= m; j++)
      {
        K[i][j] += data.delta[i] * data.Zx[j] * data.sketch_cnt;
        K[i][j] += data.delta[j] * data.Zx[i] * data.sketch_cnt;
        K[i][j] += data.delta[i] * data.delta[j] * tmp;
      }
    }
  }